

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSite.cpp
# Opt level: O3

Var Js::CrossSite::MarshalFrameDisplay(ScriptContext *scriptContext,FrameDisplay *display)

{
  ushort uVar1;
  RecyclableObject *value;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *this;
  undefined4 *puVar5;
  FrameDisplay *this_00;
  void *pvVar6;
  UnscopablesWrapperObject *pUVar7;
  Var aRight;
  uint index;
  undefined1 local_68 [8];
  TrackAllocData data;
  
  uVar1 = display->length;
  local_68 = (undefined1  [8])&FrameDisplay::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_291eab7;
  data.filename._0_4_ = 0x7f;
  data.typeinfo = (type_info *)(ulong)((uint)uVar1 * 8);
  data._32_8_ = display;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_68);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_00756453;
    *puVar5 = 0;
  }
  this_00 = (FrameDisplay *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this,(size_t)((type_info *)(ulong)((uint)uVar1 * 8) + 8));
  if (this_00 == (FrameDisplay *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x20d,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_00756453:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00->tag = true;
  this_00->strictMode = false;
  this_00->length = uVar1;
  this_00->unused = 0;
  if (uVar1 != 0) {
    index = 0;
    do {
      pvVar6 = FrameDisplay::GetItem((FrameDisplay *)data._32_8_,index);
      bVar3 = VarIs<Js::UnscopablesWrapperObject>(pvVar6);
      if (bVar3) {
        pUVar7 = VarTo<Js::UnscopablesWrapperObject>(pvVar6);
        value = (pUVar7->wrappedObject).ptr;
        aRight = MarshalVar(scriptContext,value,
                            (((((value->type).ptr)->javascriptLibrary).ptr)->
                            super_JavascriptLibraryBase).scriptContext.ptr);
        pvVar6 = JavascriptOperators::ToUnscopablesWrapperObject(aRight,scriptContext);
      }
      else {
        pvVar6 = MarshalVar(scriptContext,pvVar6,false);
      }
      FrameDisplay::SetItem(this_00,index,pvVar6);
      index = index + 1;
    } while (uVar1 != index);
  }
  return this_00;
}

Assistant:

Var CrossSite::MarshalFrameDisplay(ScriptContext* scriptContext, FrameDisplay *display)
    {
        TTD_XSITE_LOG(scriptContext, "MarshalFrameDisplay", nullptr);

        uint16 length = display->GetLength();
        FrameDisplay *newDisplay =
            RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(Var), FrameDisplay, length);
        for (uint16 i = 0; i < length; i++)
        {
            Var value = display->GetItem(i);
            if (Js::VarIs<UnscopablesWrapperObject>(value))
            {
                // Here we are marshalling the wrappedObject and then ReWrapping th object in the new context.
                RecyclableObject* wrappedObject = Js::VarTo<UnscopablesWrapperObject>(value)->GetWrappedObject();
                ScriptContext* wrappedObjectScriptContext = wrappedObject->GetScriptContext();
                value = JavascriptOperators::ToUnscopablesWrapperObject(CrossSite::MarshalVar(scriptContext,
                  wrappedObject, wrappedObjectScriptContext), scriptContext);
            }
            else
            {
                value = CrossSite::MarshalVar(scriptContext, value);
            }
            newDisplay->SetItem(i, value);
        }

        return (Var)newDisplay;
    }